

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Logon * anon_unknown.dwarf_334836::createFIX40Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  FieldBase FStack_78;
  
  FIX40::Logon::Logon(__return_storage_ptr__);
  FIX::EncryptMethod::EncryptMethod((EncryptMethod *)&FStack_78,0);
  FIX40::Logon::set(__return_storage_ptr__,(EncryptMethod *)&FStack_78);
  FIX::FieldBase::~FieldBase(&FStack_78);
  FIX::HeartBtInt::HeartBtInt((HeartBtInt *)&FStack_78,0x1e);
  FIX40::Logon::set(__return_storage_ptr__,(HeartBtInt *)&FStack_78);
  FIX::FieldBase::~FieldBase(&FStack_78);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,1);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&FStack_78,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&FStack_78,true);
  FIX::FieldBase::~FieldBase(&FStack_78);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&FStack_78,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&FStack_78,true);
  FIX::FieldBase::~FieldBase(&FStack_78);
  return __return_storage_ptr__;
}

Assistant:

FIX40::Logon createFIX40Logon(const char *sender, const char *target, int seq) {
  FIX40::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}